

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_wiznet(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  long lVar5;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var6;
  char buf [4608];
  int flag;
  CHAR_DATA *in_stack_ffffffffffffed68;
  char *pcVar7;
  CHAR_DATA *in_stack_ffffffffffffed78;
  char *in_stack_ffffffffffffed80;
  char *in_stack_ffffffffffffed90;
  char *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  ulong uVar8;
  char local_1218 [4612];
  int local_14;
  long local_8;
  
  local_8 = in_RDI;
  if (*in_RSI == '\0') {
    uVar8 = *(ulong *)(in_RDI + 0x1a0);
    _Var6 = std::pow<int,int>(0,0x584cfb);
    if ((uVar8 & (long)_Var6) == 0) {
      send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      _Var6 = std::pow<int,int>(0,0x584d6f);
      *(ulong *)(local_8 + 0x1a0) = (long)_Var6 | *(ulong *)(local_8 + 0x1a0);
    }
    else {
      send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      _Var6 = std::pow<int,int>(0,0x584d2e);
      *(ulong *)(local_8 + 0x1a0) =
           ((long)_Var6 ^ 0xffffffffffffffffU) & *(ulong *)(local_8 + 0x1a0);
    }
  }
  else {
    bVar1 = str_prefix(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
    if (bVar1) {
      bVar1 = str_prefix(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
      if (bVar1) {
        bVar1 = str_prefix(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
        if (bVar1) {
          bVar1 = str_prefix(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90);
          if (bVar1) {
            lVar5 = wiznet_lookup(in_stack_ffffffffffffeda0);
            local_14 = (int)lVar5;
            if (local_14 != -1) {
              iVar3 = get_trust(in_stack_ffffffffffffed68);
              pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                 (&wiznet_table,(long)local_14);
              if (pvVar4->level <= iVar3) {
                lVar5 = local_8;
                pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                   (&wiznet_table,(long)local_14);
                uVar8 = *(ulong *)(lVar5 + 0x1a0 + (long)(pvVar4->flag / 0x20) * 8);
                std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                          (&wiznet_table,(long)local_14);
                _Var6 = std::pow<int,int>(0,0x5851e5);
                if ((uVar8 & (long)_Var6) != 0) {
                  pcVar7 = local_1218;
                  pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                     (&wiznet_table,(long)local_14);
                  sprintf(pcVar7,"You will no longer see %s on wiznet.\n\r",pvVar4->name);
                  send_to_char(pcVar7,in_stack_ffffffffffffed78);
                  std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                            (&wiznet_table,(long)local_14);
                  _Var6 = std::pow<int,int>(0,0x585273);
                  pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                     (&wiznet_table,(long)local_14);
                  lVar5 = (long)(pvVar4->flag / 0x20);
                  *(ulong *)(local_8 + 0x1a0 + lVar5 * 8) =
                       ((long)_Var6 ^ 0xffffffffffffffffU) & *(ulong *)(local_8 + 0x1a0 + lVar5 * 8)
                  ;
                  return;
                }
                pcVar7 = local_1218;
                pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                   (&wiznet_table,(long)local_14);
                sprintf(pcVar7,"You will now see %s on wiznet.\n\r",pvVar4->name);
                send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
                std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                          (&wiznet_table,(long)local_14);
                _Var6 = std::pow<int,int>(0,0x585346);
                pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                   (&wiznet_table,(long)local_14);
                lVar5 = (long)(pvVar4->flag / 0x20);
                *(ulong *)(local_8 + 0x1a0 + lVar5 * 8) =
                     (long)_Var6 | *(ulong *)(local_8 + 0x1a0 + lVar5 * 8);
                return;
              }
            }
            send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
          }
          else {
            local_1218[0] = '\0';
            local_14 = 0;
            while (pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                      (&wiznet_table,(long)local_14), pvVar4->name != (char *)0x0) {
              pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                 (&wiznet_table,(long)local_14);
              iVar3 = pvVar4->level;
              iVar2 = get_trust(in_stack_ffffffffffffed68);
              if (iVar3 <= iVar2) {
                pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                   (&wiznet_table,(long)local_14);
                strcat(local_1218,pvVar4->name);
                strcat(local_1218," ");
              }
              local_14 = local_14 + 1;
            }
            strcat(local_1218,"\n\r");
            send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
            send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
          }
        }
        else {
          local_1218[0] = '\0';
          uVar8 = *(ulong *)(local_8 + 0x1a0);
          _Var6 = std::pow<int,int>(0,0x584e87);
          if ((uVar8 & (long)_Var6) == 0) {
            strcat(local_1218,"off ");
          }
          local_14 = 0;
          while (pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                    (&wiznet_table,(long)local_14), lVar5 = local_8,
                pvVar4->name != (char *)0x0) {
            pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                               (&wiznet_table,(long)local_14);
            uVar8 = *(ulong *)(lVar5 + 0x1a0 + (long)(pvVar4->flag / 0x20) * 8);
            std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                      (&wiznet_table,(long)local_14);
            _Var6 = std::pow<int,int>(0,0x584f45);
            if ((uVar8 & (long)_Var6) != 0) {
              pvVar4 = std::vector<wiznet_type,_std::allocator<wiznet_type>_>::operator[]
                                 (&wiznet_table,(long)local_14);
              strcat(local_1218,pvVar4->name);
              strcat(local_1218," ");
            }
            local_14 = local_14 + 1;
          }
          strcat(local_1218,"\n\r");
          send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
          send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
        _Var6 = std::pow<int,int>(0,0x584e1f);
        *(ulong *)(local_8 + 0x1a0) =
             ((long)_Var6 ^ 0xffffffffffffffffU) & *(ulong *)(local_8 + 0x1a0);
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
      _Var6 = std::pow<int,int>(0,0x584dc7);
      *(ulong *)(local_8 + 0x1a0) = (long)_Var6 | *(ulong *)(local_8 + 0x1a0);
    }
  }
  return;
}

Assistant:

void do_wiznet(CHAR_DATA *ch, char *argument)
{
	int flag;
	char buf[MAX_STRING_LENGTH];

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->wiznet, WIZ_ON))
		{
			send_to_char("Signing off of Wiznet.\n\r", ch);
			REMOVE_BIT(ch->wiznet, WIZ_ON);
		}
		else
		{
			send_to_char("Welcome to Wiznet!\n\r", ch);
			SET_BIT(ch->wiznet, WIZ_ON);
		}

		return;
	}

	if (!str_prefix(argument, "on"))
	{
		send_to_char("Welcome to Wiznet!\n\r", ch);
		SET_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	if (!str_prefix(argument, "off"))
	{
		send_to_char("Signing off of Wiznet.\n\r", ch);
		REMOVE_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	/* show wiznet status */
	if (!str_prefix(argument, "status"))
	{
		buf[0] = '\0';

		if (!IS_SET(ch->wiznet, WIZ_ON))
			strcat(buf, "off ");

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet status:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	/* list of all wiznet options */
	if (!str_prefix(argument, "show"))
	{
		buf[0] = '\0';

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (wiznet_table[flag].level <= get_trust(ch))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet options available to you are:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	flag = wiznet_lookup(argument);

	if (flag == -1 || get_trust(ch) < wiznet_table[flag].level)
	{
		send_to_char("No such option.\n\r", ch);
		return;
	}

	if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
	{
		sprintf(buf, "You will no longer see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		REMOVE_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
	else
	{
		sprintf(buf, "You will now see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		SET_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
}